

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O3

void __thiscall
wabt::BindingHash::CallCallbacks
          (BindingHash *this,ValueTypeVector *duplicates,DuplicateCallback *callback)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **pppVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **pppVar2;
  bool bVar3;
  ulong uVar4;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  __it;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *ppVar5;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  __it_00;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  _Var6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **pppVar7;
  long lVar8;
  
  pppVar7 = (duplicates->
            super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pppVar1 = (duplicates->
            super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pppVar7 == pppVar1) {
      return;
    }
    __it_00._M_current =
         (duplicates->
         super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pppVar2 = (duplicates->
              super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = (long)pppVar2 - (long)__it_00._M_current;
    __it._M_current = __it_00._M_current;
    if (0 < (long)uVar4 >> 5) {
      ppVar5 = *pppVar7;
      __it._M_current = (uVar4 & 0xffffffffffffffe0) + __it_00._M_current;
      lVar8 = ((long)uVar4 >> 5) + 1;
      do {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                              *)ppVar5,__it_00);
        _Var6._M_current = __it_00._M_current;
        if (bVar3) goto LAB_00f4396e;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                              *)ppVar5,
                             (__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                              )(__it_00._M_current + 1));
        _Var6._M_current = __it_00._M_current + 1;
        if (bVar3) goto LAB_00f4396e;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                              *)ppVar5,
                             (__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                              )(__it_00._M_current + 2));
        _Var6._M_current = __it_00._M_current + 2;
        if (bVar3) goto LAB_00f4396e;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                              *)ppVar5,
                             (__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                              )(__it_00._M_current + 3));
        _Var6._M_current = __it_00._M_current + 3;
        if (bVar3) goto LAB_00f4396e;
        __it_00._M_current = __it_00._M_current + 4;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
      uVar4 = (long)pppVar2 - (long)__it._M_current;
    }
    lVar8 = (long)uVar4 >> 3;
    if (lVar8 == 3) {
      ppVar5 = *pppVar7;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
              ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                            *)ppVar5,__it);
      _Var6._M_current = __it._M_current;
      if (!bVar3) {
        __it._M_current = __it._M_current + 1;
        goto LAB_00f4393c;
      }
    }
    else {
      if (lVar8 == 2) {
        ppVar5 = *pppVar7;
LAB_00f4393c:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                              *)ppVar5,__it);
        _Var6._M_current = __it._M_current;
        if (bVar3) goto LAB_00f4396e;
        __it._M_current = __it._M_current + 1;
      }
      else {
        _Var6._M_current = pppVar2;
        if (lVar8 != 1) goto LAB_00f4396e;
        ppVar5 = *pppVar7;
      }
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
              ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                            *)ppVar5,__it);
      _Var6._M_current = __it._M_current;
      if (!bVar3) {
        _Var6._M_current = pppVar2;
      }
    }
LAB_00f4396e:
    if (_Var6._M_current != pppVar7) {
      if (_Var6._M_current == pppVar2) {
        __assert_fail("first != duplicates.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binding-hash.cc"
                      ,0x56,
                      "void wabt::BindingHash::CallCallbacks(const ValueTypeVector &, DuplicateCallback) const"
                     );
      }
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*callback->_M_invoker)((_Any_data *)callback,*_Var6._M_current,*pppVar7);
    }
    pppVar7 = pppVar7 + 1;
  } while( true );
}

Assistant:

void BindingHash::CallCallbacks(const ValueTypeVector& duplicates,
                                DuplicateCallback callback) const {
  // Loop through all duplicates in order, and call callback with first
  // occurrence.
  for (auto iter = duplicates.begin(), end = duplicates.end(); iter != end;
       ++iter) {
    auto first = std::find_if(duplicates.begin(), duplicates.end(),
                              [iter](const value_type* x) -> bool {
                                return x->first == (*iter)->first;
                              });
    if (first == iter) {
      continue;
    }
    assert(first != duplicates.end());
    callback(**first, **iter);
  }
}